

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_fast_str_kv.cc
# Opt level: O0

void btree_fast_str_kv_set_inf_key(void *key)

{
  undefined8 *in_RDI;
  key_len_t _keylen;
  key_len_t keylen;
  void *key_ptr;
  ushort local_12;
  ushort *local_10;
  undefined8 *local_8;
  
  local_8 = in_RDI;
  local_10 = (ushort *)malloc(2);
  memset(&local_12,0xff,2);
  *local_10 = local_12 >> 8 | local_12 << 8;
  *local_8 = local_10;
  return;
}

Assistant:

void btree_fast_str_kv_set_inf_key(void *key)
{
    void *key_ptr;
    key_len_t keylen;
    key_len_t _keylen;

    // just containing length (0xff..) info
    key_ptr = (void *)malloc(sizeof(key_len_t));
    memset(&keylen, 0xff, sizeof(key_len_t));
    _keylen = _endian_encode(keylen);
    memcpy(key_ptr, &_keylen, sizeof(key_len_t));
    memcpy(key, &key_ptr, sizeof(void *));
}